

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise1d.cpp
# Opt level: O2

int ncnn::convolutiondepthwise1d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int stride_w,int dilation_w,int group,int activation_type,Mat *activation_params,
              Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  void *pvVar5;
  float *pfVar6;
  uint uVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  float *extraout_RAX;
  float *extraout_RAX_00;
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int j;
  ulong uVar21;
  float *pfVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  void *local_108;
  int local_fc;
  long local_f0;
  
  pvVar3 = bias_data->data;
  if (pvVar3 == (void *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = (long)bias_data->c * bias_data->cstep == 0;
  }
  uVar2 = top_blob->w;
  if (top_blob->h == group && bottom_blob->h == group) {
    sVar4 = top_blob->elemsize;
    pvVar5 = top_blob->data;
    pvVar16 = weight_data->data;
    uVar17 = 0;
    uVar23 = 0;
    if (0 < kernel_w) {
      uVar23 = (ulong)(uint)kernel_w;
    }
    uVar20 = 0;
    if (0 < (int)uVar2) {
      uVar20 = (ulong)uVar2;
    }
    uVar18 = (ulong)(uint)group;
    if (group < 1) {
      uVar18 = uVar17;
    }
    pfVar9 = (float *)((long)kernel_w * 4);
    for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
      pfVar9 = (float *)(long)bottom_blob->w;
      pfVar6 = (float *)activation_params->data;
      pfVar22 = (float *)(bottom_blob->elemsize * uVar17 * (long)pfVar9 + (long)bottom_blob->data);
      for (uVar21 = 0; uVar21 != uVar20; uVar21 = uVar21 + 1) {
        fVar27 = 0.0;
        if (!bVar24) {
          fVar27 = *(float *)((long)pvVar3 + uVar17 * 4);
        }
        pfVar9 = pfVar22;
        for (uVar13 = 0; uVar23 != uVar13; uVar13 = uVar13 + 1) {
          fVar27 = fVar27 + *(float *)((long)pvVar16 + uVar13 * 4) * *pfVar9;
          pfVar9 = pfVar9 + dilation_w;
        }
        pfVar10 = (float *)(ulong)(activation_type - 1U);
        pfVar9 = pfVar10;
        fVar25 = fVar27;
        if (activation_type - 1U < 6) {
          pfVar9 = (float *)((long)&switchD_002d1d99::switchdataD_002db424 +
                            (long)(int)(&switchD_002d1d99::switchdataD_002db424)[(long)pfVar10]);
          switch(pfVar10) {
          case (float *)0x0:
            if (fVar27 <= 0.0) {
              fVar25 = 0.0;
            }
            break;
          case (float *)0x1:
            pfVar9 = pfVar6;
            fVar25 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
            break;
          case (float *)0x2:
            if (fVar27 <= *pfVar6) {
              fVar27 = *pfVar6;
            }
            pfVar9 = pfVar6;
            fVar25 = fVar27;
            if (pfVar6[1] <= fVar27) {
              fVar25 = pfVar6[1];
            }
            break;
          case (float *)0x3:
            fVar27 = expf(-fVar27);
            pfVar9 = extraout_RAX_00;
            fVar25 = 1.0 / (fVar27 + 1.0);
            break;
          case (float *)0x4:
            fVar25 = expf(fVar27);
            fVar25 = logf(fVar25 + 1.0);
            fVar25 = tanhf(fVar25);
            pfVar9 = extraout_RAX;
            fVar25 = fVar25 * fVar27;
            break;
          case (float *)0x5:
            fVar1 = *pfVar6;
            fVar26 = -pfVar6[1] / fVar1;
            pfVar9 = pfVar6;
            fVar25 = 0.0;
            if ((fVar26 <= fVar27) && (fVar25 = fVar27, fVar27 <= fVar26 + 1.0 / fVar1)) {
              fVar25 = (fVar1 * fVar27 + pfVar6[1]) * fVar27;
            }
          }
        }
        *(float *)((long)pvVar5 + uVar21 * 4 + (long)(int)uVar2 * sVar4 * uVar17) = fVar25;
        pfVar22 = pfVar22 + stride_w;
      }
      pvVar16 = (void *)((long)pvVar16 + (long)kernel_w * 4);
    }
  }
  else {
    uVar17 = (long)bottom_blob->h / (long)group;
    uVar23 = (long)top_blob->h / (long)group;
    iVar12 = (int)uVar17;
    uVar7 = kernel_w;
    if (kernel_w < 1) {
      uVar7 = 0;
    }
    uVar20 = 0;
    if (0 < iVar12) {
      uVar20 = uVar17 & 0xffffffff;
    }
    uVar17 = 0;
    if (0 < (int)uVar2) {
      uVar17 = (ulong)uVar2;
    }
    iVar8 = (int)uVar23;
    uVar18 = 0;
    if (0 < iVar8) {
      uVar18 = uVar23 & 0xffffffff;
    }
    local_f0 = 0;
    if (group < 1) {
      group = 0;
    }
    local_fc = 0;
    for (pfVar9 = (float *)0x0; pfVar9 != (float *)(ulong)(uint)group;
        pfVar9 = (float *)((long)pfVar9 + 1)) {
      pvVar5 = top_blob->data;
      sVar4 = top_blob->elemsize;
      local_108 = (void *)((long)local_fc * 4 + (long)weight_data->data);
      for (uVar23 = 0; uVar23 != uVar18; uVar23 = uVar23 + 1) {
        lVar14 = uVar23 + (long)pfVar9 * (long)iVar8;
        pfVar6 = (float *)activation_params->data;
        lVar15 = 0;
        for (uVar21 = 0; uVar21 != uVar17; uVar21 = uVar21 + 1) {
          fVar27 = 0.0;
          if (!bVar24) {
            fVar27 = *(float *)((long)pvVar3 + lVar14 * 4);
          }
          lVar11 = (long)bottom_blob->w * bottom_blob->elemsize;
          pfVar22 = (float *)(lVar11 * local_f0 + lVar15 + (long)bottom_blob->data);
          pvVar16 = local_108;
          for (uVar13 = 0; uVar13 != uVar20; uVar13 = uVar13 + 1) {
            pfVar10 = pfVar22;
            for (uVar19 = 0; uVar7 != uVar19; uVar19 = uVar19 + 1) {
              fVar27 = fVar27 + *(float *)((long)pvVar16 + uVar19 * 4) * *pfVar10;
              pfVar10 = pfVar10 + dilation_w;
            }
            pvVar16 = (void *)((long)pvVar16 + (long)kernel_w * 4);
            pfVar22 = (float *)((long)pfVar22 + lVar11);
          }
          fVar25 = fVar27;
          switch(activation_type) {
          case 1:
            if (fVar27 <= 0.0) {
              fVar25 = 0.0;
            }
            break;
          case 2:
            fVar25 = (float)(~-(uint)(0.0 < fVar27) & (uint)*pfVar6 |
                            -(uint)(0.0 < fVar27) & 0x3f800000) * fVar27;
            break;
          case 3:
            if (fVar27 <= *pfVar6) {
              fVar27 = *pfVar6;
            }
            fVar25 = fVar27;
            if (pfVar6[1] <= fVar27) {
              fVar25 = pfVar6[1];
            }
            break;
          case 4:
            fVar27 = expf(-fVar27);
            fVar25 = 1.0 / (fVar27 + 1.0);
            break;
          case 5:
            fVar25 = expf(fVar27);
            fVar25 = logf(fVar25 + 1.0);
            fVar25 = tanhf(fVar25);
            fVar25 = fVar25 * fVar27;
            break;
          case 6:
            fVar1 = *pfVar6;
            fVar26 = -pfVar6[1] / fVar1;
            fVar25 = 0.0;
            if ((fVar26 <= fVar27) && (fVar25 = fVar27, fVar27 <= fVar26 + 1.0 / fVar1)) {
              fVar25 = (fVar1 * fVar27 + pfVar6[1]) * fVar27;
            }
          }
          *(float *)((long)pvVar5 + uVar21 * 4 + sVar4 * (long)(int)uVar2 * lVar14) = fVar25;
          lVar15 = lVar15 + (long)stride_w * 4;
        }
        local_108 = (void *)((long)local_108 + (long)(iVar12 * kernel_w) * 4);
      }
      local_fc = local_fc + iVar8 * iVar12 * kernel_w;
      local_f0 = local_f0 + iVar12;
    }
  }
  return (int)pfVar9;
}

Assistant:

static int convolutiondepthwise1d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int stride_w, int dilation_w, int group, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int h = bottom_blob.h;

    const int outw = top_blob.w;
    const int outh = top_blob.h;

    const int bias_term = bias_data.empty() ? 0 : 1;

    // depth-wise
    if (h == group && group == outh)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.row(g);
            const float* kptr = (const float*)weight_data + kernel_w * g;

            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[g];

                const float* sptr = bottom_blob.row(g) + j * stride_w;

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = *sptr;
                    float w = kptr[k];
                    sum += val * w;

                    sptr += dilation_w;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }
        }
    }
    else
    {
        // group convolution
        const int h_g = h / group;
        const int outh_g = outh / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < outh_g; p++)
            {
                float* outptr = top_blob.row(g * outh_g + p);
                const float* weight_data_ptr = (const float*)weight_data + kernel_w * h_g * outh_g * g;

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[outh_g * g + p];

                    const float* kptr = weight_data_ptr + kernel_w * h_g * p;

                    for (int q = 0; q < h_g; q++)
                    {
                        const float* sptr = bottom_blob.row(h_g * g + q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = *sptr;
                            float w = kptr[k];
                            sum += val * w;

                            sptr += dilation_w;
                        }

                        kptr += kernel_w;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }
            }
        }
    }

    return 0;
}